

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qipaddress.cpp
# Opt level: O0

void QIPAddressUtils::toString(QString *appendTo,IPv4Address address)

{
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>,_QString>
  *this;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>
  *in_stack_fffffffffffffd98;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>,_QString>
  *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  quint8 in_stack_fffffffffffffdc7;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>,_QString>
  local_1e8 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_1e8;
  number(in_stack_fffffffffffffdc7);
  ::operator%((QString *)in_stack_fffffffffffffd98,(char16_t *)this);
  number(in_stack_fffffffffffffdc7);
  ::operator%((QStringBuilder<QString,_char16_t> *)in_stack_fffffffffffffd98,(QString *)this);
  ::operator%((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
              in_stack_fffffffffffffd98,(char16_t *)this);
  number(in_stack_fffffffffffffdc7);
  ::operator%((QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>
               *)in_stack_fffffffffffffd98,(QString *)this);
  ::operator%(&in_stack_fffffffffffffd98->a,(char16_t *)this);
  number(in_stack_fffffffffffffdc7);
  ::operator%(in_stack_fffffffffffffd98,(QString *)this);
  ::operator+=((QString *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdb8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder(this);
  QString::~QString((QString *)0x2cca9a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>
                     *)0x2ccaa7);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
                     *)this);
  QString::~QString((QString *)0x2ccabe);
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>::
  ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>
                   *)0x2ccacb);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)this);
  QString::~QString((QString *)0x2ccae2);
  QStringBuilder<QString,_char16_t>::~QStringBuilder((QStringBuilder<QString,_char16_t> *)0x2ccaef);
  QString::~QString((QString *)0x2ccafc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void toString(QString &appendTo, IPv4Address address)
{
    // reconstructing is easy
    // use the fast operator% that pre-calculates the size
    appendTo += number(address >> 24) % u'.'
                % number(address >> 16) % u'.'
                % number(address >> 8) % u'.'
                % number(address);
}